

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

size_t __thiscall tf::TFProfObserver::num_workers(TFProfObserver *this)

{
  pointer pvVar1;
  long lVar2;
  size_t sVar3;
  pointer *ppvVar4;
  bool bVar5;
  
  pvVar1 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = ((long)(this->_timeline).segments.
                 super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  ppvVar4 = (pointer *)
            ((long)&(pvVar1->
                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                    )._M_impl.super__Vector_impl_data + 8);
  sVar3 = 0;
  while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
    sVar3 = sVar3 + (((_Vector_impl_data *)(ppvVar4 + -1))->_M_start != *ppvVar4);
    ppvVar4 = ppvVar4 + 3;
  }
  return sVar3;
}

Assistant:

inline size_t TFProfObserver::num_workers() const {
  size_t w = 0;
  for(size_t i=0; i<_timeline.segments.size(); ++i) {
    w += (!_timeline.segments[i].empty());
  }
  return w;
}